

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O0

void __thiscall absl::lts_20250127::Cord::InlineRep::AssignSlow(InlineRep *this,InlineRep *src)

{
  bool bVar1;
  Nonnull<absl::cord_internal::CordRep_*> pCVar2;
  Nullable<absl::cord_internal::CordRep_*> rep;
  CordRep *pCVar3;
  CordzInfo *this_00;
  bool local_59;
  CordRep *src_tree;
  CordRep *tree;
  MethodIdentifier method;
  InlineRep *src_local;
  InlineRep *this_local;
  
  if (src == this) {
    __assert_fail("&src != this",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/cord.cc"
                  ,0x132,"void absl::Cord::InlineRep::AssignSlow(const Cord::InlineRep &)");
  }
  bVar1 = is_tree(this);
  local_59 = true;
  if (!bVar1) {
    local_59 = is_tree(src);
  }
  if (local_59 != false) {
    bVar1 = is_tree(this);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      pCVar2 = as_tree(this);
      rep = InlineRep::tree(src);
      if (rep == (Nullable<absl::cord_internal::CordRep_*>)0x0) {
        this_00 = cord_internal::InlineData::cordz_info(&this->data_);
        if (this_00 != (CordzInfo *)0x0) {
          cord_internal::CordzInfo::Untrack(this_00);
        }
        cord_internal::InlineData::operator=(&this->data_,&src->data_);
      }
      else {
        pCVar3 = cord_internal::CordRep::Ref(rep);
        cord_internal::InlineData::set_tree(&this->data_,pCVar3);
        bVar1 = cord_internal::InlineData::is_either_profiled(&this->data_,&src->data_);
        if (bVar1) {
          cord_internal::CordzInfo::MaybeTrackCordImpl(&this->data_,&src->data_,kAssignCord);
        }
      }
      cord_internal::CordRep::Unref(pCVar2);
    }
    else {
      pCVar2 = as_tree(src);
      pCVar3 = cord_internal::CordRep::Ref(pCVar2);
      EmplaceTree(this,pCVar3,&src->data_,kAssignCord);
    }
    return;
  }
  __assert_fail("is_tree() || src.is_tree()",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/cord.cc"
                ,0x133,"void absl::Cord::InlineRep::AssignSlow(const Cord::InlineRep &)");
}

Assistant:

void Cord::InlineRep::AssignSlow(const Cord::InlineRep& src) {
  assert(&src != this);
  assert(is_tree() || src.is_tree());
  auto constexpr method = CordzUpdateTracker::kAssignCord;
  if (ABSL_PREDICT_TRUE(!is_tree())) {
    EmplaceTree(CordRep::Ref(src.as_tree()), src.data_, method);
    return;
  }

  CordRep* tree = as_tree();
  if (CordRep* src_tree = src.tree()) {
    // Leave any existing `cordz_info` in place, and let MaybeTrackCord()
    // decide if this cord should be (or remains to be) sampled or not.
    data_.set_tree(CordRep::Ref(src_tree));
    CordzInfo::MaybeTrackCord(data_, src.data_, method);
  } else {
    CordzInfo::MaybeUntrackCord(data_.cordz_info());
    data_ = src.data_;
  }
  CordRep::Unref(tree);
}